

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86_avx::create_pipeline(InnerProduct_x86_avx *this,Option *opt)

{
  _func_int *p_Var1;
  int *piVar2;
  long *plVar3;
  int iVar4;
  Layer *pLVar5;
  _func_int *p_Var6;
  byte *in_RSI;
  ParamDict *in_RDI;
  int num_input;
  ParamDict pd;
  InnerProduct_x86_avx *in_stack_00000048;
  Option *in_stack_000004d0;
  int in_stack_000004d8;
  int in_stack_000004dc;
  Mat *in_stack_000004e0;
  Mat *in_stack_000004e8;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 *puVar7;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  InnerProduct_x86_avx *in_stack_ffffffffffffffb8;
  ParamDict *in_stack_ffffffffffffffc0;
  int local_1c;
  
  pLVar5 = create_layer((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  in_RDI->d = (ParamDictPrivate *)pLVar5;
  puVar7 = &stack0xffffffffffffffc0;
  ParamDict::ParamDict(in_stack_ffffffffffffffc0);
  (**(code **)(*(long *)in_RDI->d->params + 0x10))(in_RDI->d,puVar7);
  (**(code **)(*(long *)in_RDI->d->params + 0x20))(in_RDI->d,in_RSI);
  ParamDict::~ParamDict(in_RDI);
  if (((in_RSI[0x1e] & 1) == 0) ||
     (*(long *)((long)&in_RDI[0x14]._vptr_ParamDict + (long)in_RDI->_vptr_ParamDict[-3]) != 1)) {
    iVar4 = cpu_support_x86_f16c();
    if ((iVar4 == 0) || ((in_RSI[0x22] & 1) == 0)) {
      innerproduct_transform_kernel_sse
                (in_stack_000004e8,in_stack_000004e0,in_stack_000004dc,in_stack_000004d8,
                 in_stack_000004d0);
      if ((*in_RSI & 1) != 0) {
        p_Var1 = in_RDI->_vptr_ParamDict[-3];
        p_Var6 = (_func_int *)((long)&in_RDI[0x13]._vptr_ParamDict + (long)p_Var1);
        if (*(long *)((long)&in_RDI[0x13].d + (long)p_Var1) != 0) {
          piVar2 = *(int **)((long)&in_RDI[0x13].d + (long)p_Var1);
          LOCK();
          iVar4 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar4 == 1) {
            if (*(long *)((long)&in_RDI[0x15]._vptr_ParamDict + (long)p_Var1) == 0) {
              if (*(void **)p_Var6 != (void *)0x0) {
                free(*(void **)p_Var6);
              }
            }
            else {
              plVar3 = *(long **)((long)&in_RDI[0x15]._vptr_ParamDict + (long)p_Var1);
              (**(code **)(*plVar3 + 0x18))(plVar3,*(undefined8 *)p_Var6);
            }
          }
        }
        *(undefined8 *)p_Var6 = 0;
        *(undefined8 *)((long)&in_RDI[0x14]._vptr_ParamDict + (long)p_Var1) = 0;
        *(undefined4 *)((long)&in_RDI[0x14].d + (long)p_Var1) = 0;
        *(undefined4 *)((long)&in_RDI[0x15].d + (long)p_Var1) = 0;
        *(undefined4 *)((long)&in_RDI[0x15].d + (long)(p_Var1 + 4)) = 0;
        *(undefined4 *)((long)&in_RDI[0x16]._vptr_ParamDict + (long)p_Var1) = 0;
        *(undefined4 *)((long)&in_RDI[0x16]._vptr_ParamDict + (long)(p_Var1 + 4)) = 0;
        *(undefined4 *)((long)&in_RDI[0x16].d + (long)p_Var1) = 0;
        *(undefined8 *)((long)&in_RDI[0x17]._vptr_ParamDict + (long)p_Var1) = 0;
        *(undefined8 *)((long)&in_RDI[0x13].d + (long)p_Var1) = 0;
      }
      local_1c = 0;
    }
    else {
      local_1c = create_pipeline_fp16s
                           (in_stack_ffffffffffffffb8,
                            (Option *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
      ;
    }
  }
  else {
    local_1c = create_pipeline_int8_x86(in_stack_00000048,(Option *)this);
  }
  return local_1c;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}